

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void pack_cell(cellp *p,vector<int,_std::allocator<int>_> *particle_numbers,size_t *pn_index,
              vector<particle,_std::allocator<particle>_> *particles,size_t *p_index)

{
  int *piVar1;
  double *pdVar2;
  particle *ppVar3;
  size_t sVar4;
  pointer ppVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 uVar18;
  particle *ppVar19;
  particle *ppVar20;
  ulong uVar21;
  
  ppVar3 = (p->pl).head;
  (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start[*pn_index] = 0;
  while (ppVar3 != (particle *)0x0) {
    uVar21 = ((long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
    if (uVar21 < *p_index || uVar21 - *p_index == 0) {
      std::vector<particle,_std::allocator<particle>_>::resize(particles,uVar21 + 1 + (uVar21 >> 1))
      ;
    }
    sVar4 = *p_index;
    *p_index = sVar4 + 1;
    ppVar5 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar6 = ppVar3->x;
    dVar7 = ppVar3->y;
    dVar8 = ppVar3->z;
    dVar9 = ppVar3->ux;
    dVar10 = ppVar3->uy;
    dVar11 = ppVar3->uz;
    dVar12 = ppVar3->g;
    dVar13 = ppVar3->q;
    dVar14 = ppVar3->g;
    dVar15 = ppVar3->q;
    dVar16 = ppVar3->cmr;
    dVar17 = ppVar3->chi;
    uVar18 = *(undefined8 *)&ppVar3->trn;
    ppVar19 = ppVar3->next;
    ppVar20 = ppVar3->previous;
    pdVar2 = &ppVar5[sVar4].uz;
    *pdVar2 = ppVar3->uz;
    pdVar2[1] = dVar14;
    pdVar2[2] = dVar15;
    pdVar2[3] = dVar16;
    pdVar2[4] = dVar17;
    pdVar2[5] = (double)uVar18;
    pdVar2[6] = (double)ppVar19;
    pdVar2[7] = (double)ppVar20;
    ppVar5 = ppVar5 + sVar4;
    ppVar5->x = dVar6;
    ppVar5->y = dVar7;
    ppVar5->z = dVar8;
    ppVar5->ux = dVar9;
    ppVar5->uy = dVar10;
    ppVar5->uz = dVar11;
    ppVar5->g = dVar12;
    ppVar5->q = dVar13;
    ppVar3 = ppVar3->next;
    piVar1 = (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start + *pn_index;
    *piVar1 = *piVar1 + 1;
  }
  *pn_index = *pn_index + 1;
  return;
}

Assistant:

void pack_cell(cellp & p, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    particle* current = p.pl.head;
    particle_numbers[pn_index] = 0;
    while (current != 0) {
        if (particles.size() <= p_index) {
            particles.resize(3 * particles.size() / 2 + 1);
        }
        particles[p_index++] = *current;

        current = current->next;
        particle_numbers[pn_index]++;
    }
    pn_index++;
}